

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.hpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerImpl::CommandReenroll
          (Error *__return_storage_ptr__,CommissionerImpl *this,string *param_1)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view fmt;
  format_args args;
  anon_class_1_0_00000001 local_f2;
  v10 local_f1;
  v10 *local_f0;
  size_t local_e8;
  string local_e0;
  string *local_c0;
  string *param_1_local;
  CommissionerImpl *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8 [2];
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  local_c0 = param_1;
  param_1_local = (string *)this;
  this_local = (CommissionerImpl *)__return_storage_ptr__;
  CommandReenroll::anon_class_1_0_00000001::operator()(&local_f2);
  local_58 = &local_f0;
  local_60 = &local_f1;
  bVar1 = ::fmt::v10::operator()(local_60);
  local_e8 = bVar1.size_;
  local_f0 = (v10 *)bVar1.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_78 = local_f0;
  sStack_70 = local_e8;
  local_50 = &local_78;
  local_88 = local_f0;
  local_80 = local_e8;
  local_68 = &local_e0;
  local_48 = local_88;
  sStack_40 = local_80;
  local_a8[0] = ::fmt::v10::
                make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_30 = local_98;
  local_38 = local_a8;
  local_20 = 0;
  fmt.size_ = 0;
  fmt.data_ = (char *)local_80;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_38;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(&local_e0,local_88,fmt,args);
  Error::Error(__return_storage_ptr__,kUnimplemented,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

Error CommandReenroll(const std::string &) override { return ERROR_UNIMPLEMENTED(""); }